

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

PerspectiveCameraData * __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::get
          (PerspectiveCameraData *__return_storage_ptr__,AnimatedPerspectiveCameraNode *this,
          float time)

{
  pointer pRVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  
  fVar5 = (this->time_range).lower;
  fVar5 = (time - fVar5) / ((this->time_range).upper - fVar5);
  fVar6 = floorf(fVar5);
  pRVar1 = (this->cameras).
           super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->cameras).
                super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3;
  fVar6 = (fVar5 - fVar6) * (float)(lVar4 - 1);
  fVar5 = floorf(fVar6);
  iVar2 = 0;
  if (0 < (int)fVar5) {
    iVar2 = (int)fVar5;
  }
  iVar3 = (int)lVar4 + -2;
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  fVar7 = fVar6 - (float)iVar3;
  (**(code **)((long)((pRVar1[iVar3].ptr)->super_Node).super_RefCount._vptr_RefCount + 0x80))
            (&local_68);
  (**(code **)((long)(((this->cameras).
                       super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar3 + 1].ptr)->super_Node).
                     super_RefCount._vptr_RefCount + 0x80))(fVar6,&local_a8);
  fVar5 = 1.0 - fVar7;
  (__return_storage_ptr__->from).field_0.m128[0] = local_68 * fVar5 + local_a8 * fVar7;
  (__return_storage_ptr__->from).field_0.m128[1] = fStack_64 * fVar5 + fStack_a4 * fVar7;
  (__return_storage_ptr__->from).field_0.m128[2] = fStack_60 * fVar5 + fStack_a0 * fVar7;
  (__return_storage_ptr__->from).field_0.m128[3] = fStack_5c * fVar5 + fStack_9c * fVar7;
  (__return_storage_ptr__->to).field_0.m128[0] = local_58 * fVar5 + local_98 * fVar7;
  (__return_storage_ptr__->to).field_0.m128[1] = fStack_54 * fVar5 + fStack_94 * fVar7;
  (__return_storage_ptr__->to).field_0.m128[2] = fStack_50 * fVar5 + fStack_90 * fVar7;
  (__return_storage_ptr__->to).field_0.m128[3] = fStack_4c * fVar5 + fStack_8c * fVar7;
  (__return_storage_ptr__->up).field_0.m128[0] = fVar5 * local_48 + fVar7 * local_88;
  (__return_storage_ptr__->up).field_0.m128[1] = fVar5 * fStack_44 + fVar7 * fStack_84;
  (__return_storage_ptr__->up).field_0.m128[2] = fVar5 * fStack_40 + fVar7 * fStack_80;
  (__return_storage_ptr__->up).field_0.m128[3] = fVar5 * fStack_3c + fVar7 * fStack_7c;
  __return_storage_ptr__->fov = fVar5 * local_38 + fVar7 * local_78;
  return __return_storage_ptr__;
}

Assistant:

virtual PerspectiveCameraData get(float time) const
      {
        time = frac((time-time_range.lower)/time_range.size());
        time = (cameras.size()-1)*time;
        int   itime = (int)floor(time);
        itime = min(max(itime,0),(int)cameras.size()-2);
        float ftime = time - (float)itime;
        return lerp(cameras[itime+0]->get(time), cameras[itime+1]->get(time), ftime);
      }